

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_asm.c
# Opt level: O1

void emit_asm(BuildCtx *ctx)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  BuildMode BVar4;
  BuildSym *pBVar5;
  int iVar6;
  uint uVar7;
  uint n;
  uint n_00;
  uint extraout_EDX;
  char *pcVar8;
  uint8_t *p;
  char *__format;
  FILE *pFVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  char *pcVar13;
  int *piVar14;
  
  fprintf((FILE *)ctx->fp,"\t.file \"buildvm_%s.dasc\"\n",ctx->dasm_arch);
  fwrite("\t.text\n",7,1,(FILE *)ctx->fp);
  if ((ulong)ctx->mode < 3) {
    fprintf((FILE *)ctx->fp,&DAT_00112adc + *(int *)(&DAT_00112adc + (ulong)ctx->mode * 4),4);
  }
  emit_asm_label(ctx,ctx->beginsym,0,0);
  if (ctx->mode != BUILD_machasm) {
    fwrite(".Lbegin:\n",9,1,(FILE *)ctx->fp);
  }
  if (0 < ctx->nsym) {
    lVar10 = 0;
    lVar11 = 0;
    do {
      pBVar5 = ctx->sym;
      iVar6 = pBVar5[lVar11].ofs;
      lVar12 = lVar11 + 1;
      iVar2 = pBVar5[lVar12].ofs;
      emit_asm_label(ctx,pBVar5[lVar11].name,iVar2 - iVar6,1);
      if ((int)lVar10 < ctx->nreloc) {
        lVar10 = (long)(int)lVar10;
        piVar14 = &ctx->reloc[lVar10].type;
        do {
          iVar3 = ((BuildReloc *)(piVar14 + -2))->ofs;
          if (iVar2 < iVar3) break;
          n = iVar3 - iVar6;
          p = (uint8_t *)(long)iVar6;
          if ((*piVar14 == 0) || ((ctx->mode & ~BUILD_machasm) != BUILD_elfasm)) {
            emit_asm_bytes(ctx,p + (long)ctx->code,n);
            iVar6 = *piVar14;
            pcVar13 = ctx->relocsym[piVar14[-1]];
            if (ctx->mode == BUILD_coffasm) {
              fprintf((FILE *)ctx->fp,"\t.def %s; .scl 3; .type 32; .endef\n",pcVar13);
LAB_00109b8a:
              pFVar9 = (FILE *)ctx->fp;
              if (iVar6 == 0) goto LAB_00109b9b;
              pcVar8 = "\t.long %s-.-4\n";
            }
            else {
              if (ctx->mode == BUILD_elfasm) goto LAB_00109b8a;
              pFVar9 = (FILE *)ctx->fp;
LAB_00109b9b:
              pcVar8 = "\t.long %s\n";
            }
            fprintf(pFVar9,pcVar8,pcVar13);
          }
          else {
            pcVar13 = ctx->relocsym[piVar14[-1]];
            uVar7 = piVar14[-1];
            if ((int)n < 1) {
LAB_00109d16:
              emit_asm_cold_1();
              iVar6 = *(int *)(pcVar13 + 8);
              if (iVar6 == 2) {
                fprintf(*(FILE **)(pcVar13 + 0x10),
                        "\n\t.private_extern %s\n\t.no_dead_strip %s\n%s:\n",p,p,p);
                return;
              }
              if (iVar6 == 1) {
                fprintf(*(FILE **)(pcVar13 + 0x10),"\n\t.globl %s\n",p);
                if (uVar7 != 0) {
                  fprintf(*(FILE **)(pcVar13 + 0x10),"\t.def %s; .scl 3; .type 32; .endef\n",p);
                }
                fprintf(*(FILE **)(pcVar13 + 0x10),"%s:\n",p);
                return;
              }
              if (iVar6 == 0) {
                pcVar8 = "function";
                if (uVar7 == 0) {
                  pcVar8 = "object";
                }
                fprintf(*(FILE **)(pcVar13 + 0x10),
                        "\n\t.globl %s\n\t.hidden %s\n\t.type %s, @%s\n\t.size %s, %d\n%s:\n",p,p,p,
                        pcVar8,p,(ulong)extraout_EDX,p);
              }
              return;
            }
            p = p + (long)ctx->code;
            n_00 = n - 1;
            bVar1 = p[n_00];
            uVar7 = (uint)bVar1;
            if (bVar1 == 0xe8) {
              pcVar8 = "call";
            }
            else if (bVar1 == 0xe9) {
              pcVar8 = "jmp";
            }
            else {
              if ((((-1 < (char)bVar1) || (n == 1)) || (0x8f < bVar1)) ||
                 (uVar7 = (uint)bVar1, p[(ulong)n - 2] != '\x0f')) goto LAB_00109d16;
              pcVar8 = jccnames_rel + *(int *)(jccnames_rel + (ulong)(bVar1 & 0x7f) * 4);
              n_00 = n - 2;
            }
            emit_asm_bytes(ctx,p,n_00);
            iVar6 = strncmp(pcVar13 + (*pcVar13 == '_'),"lj_",3);
            if ((iVar6 == 0) || (ctx->mode != BUILD_elfasm)) {
              pFVar9 = (FILE *)ctx->fp;
              __format = "\t%s %s\n";
            }
            else {
              pFVar9 = (FILE *)ctx->fp;
              __format = "\t%s %s@PLT\n";
            }
            fprintf(pFVar9,__format,pcVar8,pcVar13);
          }
          iVar6 = iVar3 + 4;
          lVar10 = lVar10 + 1;
          piVar14 = piVar14 + 3;
        } while (lVar10 < ctx->nreloc);
      }
      emit_asm_bytes(ctx,ctx->code + iVar6,iVar2 - iVar6);
      lVar11 = lVar12;
    } while (lVar12 < ctx->nsym);
  }
  fputc(10,(FILE *)ctx->fp);
  BVar4 = ctx->mode;
  if (BVar4 == BUILD_machasm) {
    pcVar13 = "\t.cstring\n\t.ascii \"%s\\0\"\n";
  }
  else {
    pcVar13 = "\t.ident \"%s\"\n";
    if (BVar4 != BUILD_coffasm) {
      if (BVar4 != BUILD_elfasm) goto LAB_00109cfa;
      fwrite("\t.section .note.GNU-stack,\"\",@progbits\n",0x27,1,(FILE *)ctx->fp);
    }
  }
  fprintf((FILE *)ctx->fp,pcVar13,ctx->dasm_ident);
LAB_00109cfa:
  fputc(10,(FILE *)ctx->fp);
  return;
}

Assistant:

void emit_asm(BuildCtx *ctx)
{
  int i, rel;

  fprintf(ctx->fp, "\t.file \"buildvm_%s.dasc\"\n", ctx->dasm_arch);
  fprintf(ctx->fp, "\t.text\n");
#if LJ_TARGET_MIPS32 && !LJ_ABI_SOFTFP
  fprintf(ctx->fp, "\t.module fp=32\n");
#endif
#if LJ_TARGET_MIPS
  fprintf(ctx->fp, "\t.set nomips16\n\t.abicalls\n\t.set noreorder\n\t.set nomacro\n");
#endif
  emit_asm_align(ctx, 4);

#if LJ_TARGET_PS3
  emit_asm_label(ctx, ctx->beginsym, ctx->codesz, 0);
#else
  emit_asm_label(ctx, ctx->beginsym, 0, 0);
#endif
  if (ctx->mode != BUILD_machasm)
    fprintf(ctx->fp, ".Lbegin:\n");

#if LJ_TARGET_ARM && defined(__GNUC__) && !LJ_NO_UNWIND
  /* This should really be moved into buildvm_arm.dasc. */
#if LJ_ARCH_HASFPU
  fprintf(ctx->fp,
	  ".fnstart\n"
	  ".save {r5, r6, r7, r8, r9, r10, r11, lr}\n"
	  ".vsave {d8-d15}\n"
	  ".save {r4}\n"
	  ".pad #28\n");
#else
  fprintf(ctx->fp,
	  ".fnstart\n"
	  ".save {r4, r5, r6, r7, r8, r9, r10, r11, lr}\n"
	  ".pad #28\n");
#endif
#endif

  for (i = rel = 0; i < ctx->nsym; i++) {
    int32_t ofs = ctx->sym[i].ofs;
    int32_t next = ctx->sym[i+1].ofs;
#if LJ_TARGET_ARM && defined(__GNUC__) && !LJ_NO_UNWIND && LJ_HASFFI
    if (!strcmp(ctx->sym[i].name, "lj_vm_ffi_call"))
      fprintf(ctx->fp,
	      ".globl lj_err_unwind_arm\n"
	      ".personality lj_err_unwind_arm\n"
	      ".fnend\n"
	      ".fnstart\n"
	      ".save {r4, r5, r11, lr}\n"
	      ".setfp r11, sp\n");
#endif
    emit_asm_label(ctx, ctx->sym[i].name, next - ofs, 1);
    while (rel < ctx->nreloc && ctx->reloc[rel].ofs <= next) {
      BuildReloc *r = &ctx->reloc[rel];
      int n = r->ofs - ofs;
#if LJ_TARGET_X86ORX64
      if (r->type != 0 &&
	  (ctx->mode == BUILD_elfasm || ctx->mode == BUILD_machasm)) {
	emit_asm_reloc_text(ctx, ctx->code+ofs, n, ctx->relocsym[r->sym]);
      } else {
	emit_asm_bytes(ctx, ctx->code+ofs, n);
	emit_asm_reloc(ctx, r->type, ctx->relocsym[r->sym]);
      }
      ofs += n+4;
#else
      emit_asm_wordreloc(ctx, ctx->code+ofs, n, ctx->relocsym[r->sym]);
      ofs += n;
#endif
      rel++;
    }
#if LJ_TARGET_X86ORX64
    emit_asm_bytes(ctx, ctx->code+ofs, next-ofs);
#else
    emit_asm_words(ctx, ctx->code+ofs, next-ofs);
#endif
  }

#if LJ_TARGET_ARM && defined(__GNUC__) && !LJ_NO_UNWIND
  fprintf(ctx->fp,
#if !LJ_HASFFI
	  ".globl lj_err_unwind_arm\n"
	  ".personality lj_err_unwind_arm\n"
#endif
	  ".fnend\n");
#endif

  fprintf(ctx->fp, "\n");
  switch (ctx->mode) {
  case BUILD_elfasm:
#if !(LJ_TARGET_PS3 || LJ_TARGET_PSVITA)
    fprintf(ctx->fp, "\t.section .note.GNU-stack,\"\"," ELFASM_PX "progbits\n");
#endif
#if LJ_TARGET_PPC && !LJ_TARGET_PS3 && !LJ_ABI_SOFTFP
    /* Hard-float ABI. */
    fprintf(ctx->fp, "\t.gnu_attribute 4, 1\n");
#endif
    /* fallthrough */
  case BUILD_coffasm:
    fprintf(ctx->fp, "\t.ident \"%s\"\n", ctx->dasm_ident);
    break;
  case BUILD_machasm:
    fprintf(ctx->fp,
      "\t.cstring\n"
      "\t.ascii \"%s\\0\"\n", ctx->dasm_ident);
    break;
  default:
    break;
  }
  fprintf(ctx->fp, "\n");
}